

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial_array.h
# Opt level: O2

Split * __thiscall
embree::sse2::
HeuristicArraySpatialSAH<embree::sse2::QuadSplitterFactory,_embree::PrimRef,_32UL,_16UL>::find
          (Split *__return_storage_ptr__,
          HeuristicArraySpatialSAH<embree::sse2::QuadSplitterFactory,_embree::PrimRef,_32UL,_16UL>
          *this,PrimInfoExtRange *set,size_t logBlockSize)

{
  unsigned_long uVar1;
  CentGeomBBox3fa *pCVar2;
  undefined1 auVar3 [16];
  float fVar4;
  float fVar5;
  float fVar6;
  char cVar7;
  uint uVar8;
  size_t sVar9;
  undefined4 uVar10;
  float fVar11;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar12 [16];
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  float fVar20;
  float fVar21;
  SpatialSplit spatial_split;
  ObjectSplit object_split;
  SplitInfo oinfo;
  SpatialSplit local_108;
  ObjectSplit local_b8;
  SplitInfo local_78;
  
  if ((set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end -
      (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin < 0xc00) {
    sVar9 = logBlockSize;
    sequential_object_find(&local_b8,this,set,logBlockSize,&local_78);
    uVar10 = (undefined4)sVar9;
  }
  else {
    sVar9 = logBlockSize;
    parallel_object_find(&local_b8,this,set,logBlockSize,&local_78);
    uVar10 = (undefined4)sVar9;
  }
  fVar6 = local_b8.sah;
  uVar1 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end;
  if ((set->super_extended_range<unsigned_long>)._ext_end != uVar1) {
    auVar19 = maxps((undefined1  [16])local_78.leftBounds.lower.field_0,
                    (undefined1  [16])local_78.rightBounds.lower.field_0);
    auVar12 = minps((undefined1  [16])local_78.leftBounds.upper.field_0,
                    (undefined1  [16])local_78.rightBounds.upper.field_0);
    auVar3._4_4_ = -(uint)(auVar19._4_4_ <= auVar12._4_4_);
    auVar3._0_4_ = -(uint)(auVar19._0_4_ <= auVar12._0_4_);
    auVar3._8_4_ = -(uint)(auVar19._8_4_ <= auVar12._8_4_);
    auVar3._12_4_ = -(uint)(auVar19._12_4_ <= auVar12._12_4_);
    uVar8 = movmskps(uVar10,auVar3);
    fVar17 = 0.0;
    fVar11 = auVar12._0_4_ - auVar19._0_4_;
    fVar13 = auVar12._4_4_ - auVar19._4_4_;
    fVar15 = auVar12._8_4_ - auVar19._8_4_;
    fVar18 = 0.0;
    cVar7 = (char)(uVar8 & 0xffffff07);
    if (cVar7 == '\a') {
      fVar18 = (fVar13 + fVar15) * fVar11 + fVar15 * fVar13;
      fVar18 = fVar18 + fVar18;
    }
    pCVar2 = this->root_info;
    fVar4 = (pCVar2->geomBounds).lower.field_0.m128[0];
    fVar14 = (pCVar2->geomBounds).lower.field_0.m128[1];
    fVar16 = (pCVar2->geomBounds).lower.field_0.m128[2];
    fVar5 = (pCVar2->geomBounds).upper.field_0.m128[0];
    fVar20 = (pCVar2->geomBounds).upper.field_0.m128[1];
    fVar21 = (pCVar2->geomBounds).upper.field_0.m128[2];
    auVar12._4_4_ = -(uint)(fVar14 <= fVar20);
    auVar12._0_4_ = -(uint)(fVar4 <= fVar5);
    auVar12._8_4_ = -(uint)(fVar16 <= fVar21);
    auVar12._12_4_ =
         -(uint)((pCVar2->geomBounds).lower.field_0.m128[3] <=
                (pCVar2->geomBounds).upper.field_0.m128[3]);
    uVar10 = movmskps((int)pCVar2,auVar12);
    if ((~(byte)uVar10 & 7) == 0) {
      fVar20 = fVar20 - fVar14;
      fVar21 = fVar21 - fVar16;
      fVar17 = (fVar20 + fVar21) * (fVar5 - fVar4) + fVar21 * fVar20;
      fVar17 = (fVar17 + fVar17) * 5e-06;
    }
    if (fVar17 <= fVar18) {
      fVar18 = 0.0;
      fVar17 = 0.0;
      if (cVar7 == '\a') {
        fVar17 = (fVar13 + fVar15) * fVar11 + fVar15 * fVar13;
        fVar17 = fVar17 + fVar17;
      }
      fVar11 = (set->super_CentGeomBBox3fa).geomBounds.lower.field_0.m128[0];
      fVar13 = (set->super_CentGeomBBox3fa).geomBounds.lower.field_0.m128[1];
      fVar15 = (set->super_CentGeomBBox3fa).geomBounds.lower.field_0.m128[2];
      fVar4 = (set->super_CentGeomBBox3fa).geomBounds.upper.field_0.m128[0];
      fVar14 = (set->super_CentGeomBBox3fa).geomBounds.upper.field_0.m128[1];
      fVar16 = (set->super_CentGeomBBox3fa).geomBounds.upper.field_0.m128[2];
      auVar19._4_4_ = -(uint)(fVar13 <= fVar14);
      auVar19._0_4_ = -(uint)(fVar11 <= fVar4);
      auVar19._8_4_ = -(uint)(fVar15 <= fVar16);
      auVar19._12_4_ =
           -(uint)((set->super_CentGeomBBox3fa).geomBounds.lower.field_0.m128[3] <=
                  (set->super_CentGeomBBox3fa).geomBounds.upper.field_0.m128[3]);
      uVar10 = movmskps(uVar8 & 0xffffff07,auVar19);
      if ((~(byte)uVar10 & 7) == 0) {
        fVar14 = fVar14 - fVar13;
        fVar16 = fVar16 - fVar15;
        fVar11 = (fVar14 + fVar16) * (fVar4 - fVar11) + fVar16 * fVar14;
        fVar18 = (fVar11 + fVar11) * 0.1;
      }
      if (fVar18 <= fVar17) {
        if (uVar1 - (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin <
            0xc00) {
          sequential_spatial_find(&local_108,this,set,logBlockSize);
        }
        else {
          parallel_spatial_find(&local_108,this,set,logBlockSize);
        }
        if ((local_108.sah < fVar6 * 0.99) &&
           (uVar1 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end,
           ((set->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin - uVar1) +
           (long)local_108.right + (long)local_108.left <=
           (set->super_extended_range<unsigned_long>)._ext_end - uVar1)) {
          __return_storage_ptr__->spatial = true;
          __return_storage_ptr__->sah = local_108.sah;
          *(ulong *)__return_storage_ptr__->data = CONCAT44(local_108.dim,local_108.sah);
          *(ulong *)(__return_storage_ptr__->data + 8) = CONCAT44(local_108.left,local_108.pos);
          *(ulong *)(__return_storage_ptr__->data + 0x10) =
               CONCAT44(local_108.factor,local_108.right);
          *(undefined8 *)(__return_storage_ptr__->data + 0x20) = local_108.mapping.ofs.field_0._0_8_
          ;
          *(undefined8 *)(__return_storage_ptr__->data + 0x28) = local_108.mapping.ofs.field_0._8_8_
          ;
          *(undefined8 *)(__return_storage_ptr__->data + 0x30) =
               local_108.mapping.scale.field_0._0_8_;
          *(undefined8 *)(__return_storage_ptr__->data + 0x38) =
               local_108.mapping.scale.field_0._8_8_;
          *(undefined8 *)(__return_storage_ptr__->data + 0x40) =
               local_108.mapping.inv_scale.field_0._0_8_;
          *(undefined8 *)(__return_storage_ptr__->data + 0x48) =
               local_108.mapping.inv_scale.field_0._8_8_;
          return __return_storage_ptr__;
        }
      }
    }
  }
  __return_storage_ptr__->spatial = false;
  __return_storage_ptr__->sah = fVar6;
  *(ulong *)__return_storage_ptr__->data = CONCAT44(local_b8.dim,local_b8.sah);
  *(undefined8 *)(__return_storage_ptr__->data + 8) = local_b8._8_8_;
  *(size_t *)(__return_storage_ptr__->data + 0x10) = local_b8.mapping.num;
  *(undefined8 *)(__return_storage_ptr__->data + 0x20) = local_b8.mapping.ofs.field_0._0_8_;
  *(undefined8 *)(__return_storage_ptr__->data + 0x28) = local_b8.mapping.ofs.field_0._8_8_;
  *(undefined8 *)(__return_storage_ptr__->data + 0x30) = local_b8.mapping.scale.field_0._0_8_;
  *(undefined8 *)(__return_storage_ptr__->data + 0x38) = local_b8.mapping.scale.field_0._8_8_;
  return __return_storage_ptr__;
}

Assistant:

const Split find(const PrimInfoExtRange& set, const size_t logBlockSize)
        {
          SplitInfo oinfo;
          const ObjectSplit object_split = object_find(set,logBlockSize,oinfo);
          const float object_split_sah = object_split.splitSAH();

          if (unlikely(set.has_ext_range()))
          {
            const BBox3fa overlap = intersect(oinfo.leftBounds, oinfo.rightBounds);
            
            /* do only spatial splits if the child bounds overlap */
            if (safeArea(overlap) >= SPATIAL_ASPLIT_AREA_THRESHOLD*safeArea(root_info.geomBounds) &&
                safeArea(overlap) >= SPATIAL_ASPLIT_OVERLAP_THRESHOLD*safeArea(set.geomBounds))
            {              
              const SpatialSplit spatial_split = spatial_find(set, logBlockSize);
              const float spatial_split_sah = spatial_split.splitSAH();

              /* valid spatial split, better SAH and number of splits do not exceed extended range */
              if (spatial_split_sah < SPATIAL_ASPLIT_SAH_THRESHOLD*object_split_sah &&
                  spatial_split.left + spatial_split.right - set.size() <= set.ext_range_size())
              {          
                return Split(spatial_split,spatial_split_sah);
              }
            }
          }

          return Split(object_split,object_split_sah);
        }